

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Console.cpp
# Opt level: O2

void Console::Prompt::Private::handleWinch(int sig)

{
  uint64 event;
  
  if (resizeEventFd != 0) {
    event = 1;
    write(resizeEventFd,&event,8);
  }
  return;
}

Assistant:

static void handleWinch(int sig)
  {
#ifndef __CYGWIN__
    int eventFd = resizeEventFd;
#else
    int eventFd = resizeEventFdWrite;
#endif
    if(eventFd)
    {
      uint64 event = 1;
      if(write(eventFd, &event, sizeof(uint64)) != sizeof(uint64))
        return;
    }
  }